

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dchClass.c
# Opt level: O2

Dch_Cla_t * Dch_ClassesStart(Aig_Man_t *pAig)

{
  Dch_Cla_t *pDVar1;
  Aig_Obj_t ***pppAVar2;
  int *piVar3;
  Vec_Ptr_t *pVVar4;
  int nCap;
  size_t __nmemb;
  
  pDVar1 = (Dch_Cla_t *)calloc(1,0x68);
  pDVar1->pAig = pAig;
  __nmemb = (size_t)pAig->vObjs->nSize;
  pppAVar2 = (Aig_Obj_t ***)calloc(__nmemb,8);
  pDVar1->pId2Class = pppAVar2;
  piVar3 = (int *)calloc(__nmemb,4);
  pDVar1->pClassSizes = piVar3;
  nCap = (int)__nmemb;
  pVVar4 = Vec_PtrAlloc(nCap);
  pDVar1->vClassOld = pVVar4;
  pVVar4 = Vec_PtrAlloc(nCap);
  pDVar1->vClassNew = pVVar4;
  if (pAig->pReprs == (Aig_Obj_t **)0x0) {
    Aig_ManReprStart(pAig,pAig->vObjs->nSize);
    return pDVar1;
  }
  __assert_fail("pAig->pReprs == NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/dch/dchClass.c"
                ,0x93,"Dch_Cla_t *Dch_ClassesStart(Aig_Man_t *)");
}

Assistant:

Dch_Cla_t * Dch_ClassesStart( Aig_Man_t * pAig )
{
    Dch_Cla_t * p;
    p = ABC_ALLOC( Dch_Cla_t, 1 );
    memset( p, 0, sizeof(Dch_Cla_t) );
    p->pAig         = pAig;
    p->pId2Class    = ABC_CALLOC( Aig_Obj_t **, Aig_ManObjNumMax(pAig) );
    p->pClassSizes  = ABC_CALLOC( int, Aig_ManObjNumMax(pAig) );
    p->vClassOld    = Vec_PtrAlloc( 100 );
    p->vClassNew    = Vec_PtrAlloc( 100 );
    assert( pAig->pReprs == NULL );
    Aig_ManReprStart( pAig, Aig_ManObjNumMax(pAig) );
    return p;
}